

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O3

void __thiscall
TestCase::TestFailedInternal(TestCase *this,char *filename,int line_num,char *fmt,...)

{
  char *pcVar1;
  char in_AL;
  char cVar2;
  Thread *this_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list params;
  __va_list_tag local_108;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  Mutex::Lock();
  pcVar1 = (char *)(this->mFilename)._M_string_length;
  strlen(filename);
  std::__cxx11::string::_M_replace((ulong)&this->mFilename,0,pcVar1,(ulong)filename);
  this->mLineNumber = line_num;
  local_108.gp_offset = 0x20;
  local_108.fp_offset = 0x30;
  local_108.overflow_arg_area = &stack0x00000008;
  local_108.reg_save_area = local_e8;
  JetHead::stl_vsprintf<std::__cxx11::string>(&this->mErrorString,fmt,&local_108);
  if (this->mTestComplete == true) {
    puts(" BAD TEST CASE, TestPassed/TestFailed already called");
  }
  this->mTestComplete = true;
  this->mTestPassed = false;
  Mutex::Unlock();
  this_00 = (Thread *)JHThread::Thread::GetCurrent();
  cVar2 = JHThread::Thread::operator==(this_00,&(this->mThread).super_Thread);
  if (cVar2 == '\0') {
    JHThread::Thread::Stop();
  }
  else {
    JHThread::Thread::Exit();
  }
  return;
}

Assistant:

void TestFailedInternal( const char *filename, int line_num, const char *fmt, ... ) __attribute__ ((__format__ (__printf__, 4, 5)))
	{
		va_list params;

		mMutex.Lock();

		mFilename = filename;
		mLineNumber = line_num;
		
		va_start( params, fmt );
		JetHead::stl_vsprintf( mErrorString, fmt, params );
		va_end( params );

		if ( mTestComplete )
			printf( " BAD TEST CASE, TestPassed/TestFailed already called\n" );

		mTestComplete = true;
		mTestPassed = false;
		mMutex.Unlock();
		
		if ( *(Thread::GetCurrent()) == mThread )
			Thread::Exit();
		else
			mThread.Stop();
	}